

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

int __thiscall vkt::ssbo::SSBOLayoutCase::init(SSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  int iVar2;
  char *pcVar3;
  MatrixLoadFlags matrixLoadFlag;
  BufferLayout *layout;
  string local_30;
  SSBOLayoutCase *local_10;
  SSBOLayoutCase *this_local;
  
  local_10 = this;
  anon_unknown_15::computeReferenceLayout(&this->m_refLayout,&this->m_interface);
  anon_unknown_15::initRefDataStorage(&this->m_interface,&this->m_refLayout,&this->m_initialData);
  anon_unknown_15::initRefDataStorage(&this->m_interface,&this->m_refLayout,&this->m_writeData);
  layout = &this->m_refLayout;
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(pcVar3);
  anon_unknown_15::generateValues(layout,&(this->m_initialData).pointers,dVar1 ^ 0xad2f7214);
  matrixLoadFlag = (MatrixLoadFlags)layout;
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(pcVar3);
  anon_unknown_15::generateValues
            (&this->m_refLayout,&(this->m_writeData).pointers,dVar1 ^ 0x25ca4e7);
  anon_unknown_15::copyNonWrittenData
            (&this->m_interface,&this->m_refLayout,&(this->m_initialData).pointers,
             &(this->m_writeData).pointers);
  ssbo::(anonymous_namespace)::generateComputeShader_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)&this->m_interface,
             (ShaderInterface *)&this->m_refLayout,(BufferLayout *)&(this->m_initialData).pointers,
             &(this->m_writeData).pointers,
             (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
             (ulong)this->m_matrixLoadFlag,matrixLoadFlag);
  std::__cxx11::string::operator=((string *)&this->m_computeShaderSrc,(string *)&local_30);
  iVar2 = std::__cxx11::string::~string((string *)&local_30);
  return iVar2;
}

Assistant:

void SSBOLayoutCase::init ()
{
	computeReferenceLayout	(m_refLayout, m_interface);
	initRefDataStorage		(m_interface, m_refLayout, m_initialData);
	initRefDataStorage		(m_interface, m_refLayout, m_writeData);
	generateValues			(m_refLayout, m_initialData.pointers, deStringHash(getName()) ^ 0xad2f7214);
	generateValues			(m_refLayout, m_writeData.pointers, deStringHash(getName()) ^ 0x25ca4e7);
	copyNonWrittenData		(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers);

	m_computeShaderSrc = generateComputeShader(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers, m_matrixLoadFlag);

}